

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

GPU_Target * GPU_Init(Uint16 w,Uint16 h,GPU_WindowFlagEnum SDL_flags)

{
  _Bool _Var1;
  GPU_Target *pGVar2;
  long lVar3;
  GPU_RendererID *order;
  int renderer_order_size;
  GPU_RendererID renderer_order [10];
  int local_12c;
  GPU_RendererID local_128 [10];
  
  gpu_init_error_queue();
  gpu_init_renderer_register();
  _Var1 = gpu_init_SDL();
  if (_Var1) {
    local_12c = 0;
    order = local_128;
    GPU_GetRendererOrder(&local_12c,order);
    if (0 < local_12c) {
      lVar3 = 0;
      do {
        pGVar2 = GPU_InitRendererByID(*order,w,h,SDL_flags);
        if (pGVar2 != (GPU_Target *)0x0) {
          return pGVar2;
        }
        lVar3 = lVar3 + 1;
        order = order + 1;
      } while (lVar3 < local_12c);
    }
    GPU_PushErrorCode("GPU_Init",GPU_ERROR_BACKEND_ERROR,
                      "No renderer out of %d was able to initialize properly");
  }
  return (GPU_Target *)0x0;
}

Assistant:

GPU_Target* GPU_Init(Uint16 w, Uint16 h, GPU_WindowFlagEnum SDL_flags)
{
    int renderer_order_size;
    int i;
    GPU_RendererID renderer_order[GPU_RENDERER_ORDER_MAX];

    gpu_init_error_queue();

    gpu_init_renderer_register();

    if(!gpu_init_SDL())
        return NULL;

    renderer_order_size = 0;
    GPU_GetRendererOrder(&renderer_order_size, renderer_order);

    // Init the renderers in order
    for(i = 0; i < renderer_order_size; i++)
    {
        GPU_Target* screen = GPU_InitRendererByID(renderer_order[i], w, h, SDL_flags);
        if(screen != NULL)
            return screen;
    }

    GPU_PushErrorCode("GPU_Init", GPU_ERROR_BACKEND_ERROR, "No renderer out of %d was able to initialize properly", renderer_order_size);
    return NULL;
}